

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O3

SQInteger squall::detail::stub<1,std::function<int(Foo_const*)>>(HSQUIRRELVM vm)

{
  int iVar1;
  SQRESULT SVar2;
  function<int_(const_Foo_*)> *pfVar3;
  Foo *in_R8;
  partial_application<std::function<int_(const_Foo_*)>_&,_const_Foo_*> f;
  SQUserPointer fp;
  undefined8 *local_a8 [4];
  _Any_data local_88;
  _Manager_type local_78;
  
  SVar2 = sq_getuserdata(vm,-1,local_a8,(SQUserPointer *)0x0);
  if (-1 < SVar2) {
    std::function<int_(const_Foo_*)>::function
              ((function<int_(const_Foo_*)> *)&local_88,(function<int_(const_Foo_*)> *)*local_a8[0])
    ;
    pfVar3 = (function<int_(const_Foo_*)> *)
             Fetch<const_Foo_*,_(squall::detail::FetchContext)0>::doit(vm,1);
    f.arg = in_R8;
    f.f = pfVar3;
    iVar1 = Stub<int()>::
            doit<squall::detail::partial_application<std::function<int(Foo_const*)>&,Foo_const*>>
                      ((Stub<int()> *)vm,(HSQUIRRELVM)0x2,(SQInteger)&local_88,f);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    return (long)iVar1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/../squall/squall_defun.hpp"
                ,0x42,
                "SQInteger squall::detail::stub(HSQUIRRELVM) [Offset = 1, F = std::function<int (const Foo *)>]"
               );
}

Assistant:

SQInteger stub(HSQUIRRELVM vm) {
    try {
        SQUserPointer fp;
        if(!SQ_SUCCEEDED(sq_getuserdata(vm, -1, &fp, NULL))) { assert(0); }
        const F& f = **((F**)fp);

        SQInteger x = Stub<typename detail::function_traits<F>::type>::doit(
            vm, Offset, f);
        return x;
    }
    catch(std::exception& e) {
        return sq_throwerror(
            vm, (string(_SC("error in callback: ")) + locale_converter::to_squall_string(e.what()).c_str()).c_str());
    }
}